

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swipe.cc
# Opt level: O0

matrix sptk::swipe::loudness(vector x,vector fERBs,double nyquist,int w,int w2)

{
  double dVar1;
  vector yr_vector;
  vector yr_vector_00;
  vector fERBs_00;
  vector fERBs_01;
  vector fERBs_02;
  vector f_00;
  vector f_01;
  vector f_02;
  matrix L_00;
  matrix L_01;
  matrix mVar2;
  uint uVar3;
  reference pvVar4;
  RealValuedFastFourierTransform *in_RCX;
  undefined4 in_EDX;
  double *pdVar5;
  pointer in_RSI;
  int in_EDI;
  int in_R8D;
  int in_R9D;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  vector vVar6;
  matrix mVar7;
  vector f;
  vector hann;
  Buffer buffer;
  RealValuedFastFourierTransform plan;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  fo;
  vector<double,_std::allocator<double>_> fi;
  double td;
  int offset;
  int hi;
  int j;
  int i;
  matrix L;
  undefined1 *puVar8;
  int in_stack_fffffffffffffd10;
  int in_stack_fffffffffffffd14;
  RealValuedFastFourierTransform *this;
  allocator_type *in_stack_fffffffffffffd18;
  allocator_type *in_stack_fffffffffffffd20;
  vector<double,_std::allocator<double>_> *this_00;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  undefined8 in_stack_fffffffffffffd48;
  double dVar9;
  RealValuedFastFourierTransform *in_stack_fffffffffffffd50;
  undefined8 in_stack_fffffffffffffe08;
  RealValuedFastFourierTransform *in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe18;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe28;
  double **in_stack_fffffffffffffe30;
  RealValuedFastFourierTransform *plan_00;
  vector<double,_std::allocator<double>_> *fi_00;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *fo_00;
  Buffer *buffer_00;
  double **ppdVar10;
  undefined8 uVar11;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *pvVar12;
  undefined4 uStack_184;
  vector<double,_std::allocator<double>_> local_168 [2];
  undefined1 local_130 [184];
  undefined1 local_78 [80];
  int local_28;
  pointer local_20;
  int local_18;
  int iStack_14;
  double **ppdStack_10;
  
  local_78._32_4_ = 0;
  local_78._24_8_ = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da) / (double)in_R9D;
  local_78._48_4_ = in_R9D;
  local_78._52_4_ = in_R8D;
  local_78._64_4_ = in_EDX;
  local_78._72_8_ = in_RCX;
  local_28 = in_EDI;
  local_20 = in_RSI;
  std::allocator<double>::allocator((allocator<double> *)0x12fd3e);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
             CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),in_stack_fffffffffffffd20
            );
  std::allocator<double>::~allocator((allocator<double> *)0x12fd6a);
  std::allocator<double>::allocator((allocator<double> *)0x12fd8f);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
             CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),in_stack_fffffffffffffd20
            );
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x12fdc3);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
           CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
           (value_type *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
            ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x12fdf4);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd20);
  std::allocator<double>::~allocator((allocator<double> *)0x12fe0e);
  RealValuedFastFourierTransform::RealValuedFastFourierTransform
            (in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20),
             (int)in_stack_fffffffffffffd48);
  RealValuedFastFourierTransform::Buffer::Buffer
            ((Buffer *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
  vVar6 = makev(0);
  pdVar5 = vVar6.v;
  for (local_78._44_4_ = 0; (int)local_78._44_4_ < (int)local_78._52_4_;
      local_78._44_4_ = local_78._44_4_ + 1) {
    dVar9 = cos(((double)(int)local_78._44_4_ / (double)(int)local_78._52_4_) * 6.283185307179586);
    pdVar5[(int)local_78._44_4_] = dVar9 * -0.5 + 0.5;
  }
  vVar6 = makev(0);
  uVar3 = vVar6.x;
  for (local_78._44_4_ = 0; (int)local_78._44_4_ < (int)local_78._48_4_;
      local_78._44_4_ = local_78._44_4_ + 1) {
    (&((vVar6.v)->
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start)[(int)local_78._44_4_] =
         (pointer)((double)(int)local_78._44_4_ * (double)local_78._24_8_);
  }
  uVar11 = CONCAT44(uStack_184,uVar3);
  vVar6._0_8_ = vVar6.v;
  pvVar12 = vVar6.v;
  local_78._36_4_ = bisectv((swipe *)(ulong)uVar3,vVar6,(double)*(_func_int ***)local_78._72_8_);
  ceil((double)local_28 / (double)(int)local_78._48_4_);
  mVar7 = makem(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10);
  ppdStack_10 = mVar7.m;
  local_18 = mVar7.x;
  iStack_14 = mVar7.y;
  for (local_78._40_4_ = 0; (int)local_78._40_4_ < (int)local_78._48_4_;
      local_78._40_4_ = local_78._40_4_ + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_78,
                        (long)(int)local_78._40_4_);
    *pvVar4 = 0.0;
  }
  for (; (int)local_78._40_4_ < (int)local_78._52_4_; local_78._40_4_ = local_78._40_4_ + 1) {
    dVar9 = local_20[(int)(local_78._40_4_ - local_78._48_4_)] * pdVar5[(int)local_78._40_4_];
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_78,
                        (long)(int)local_78._40_4_);
    *pvVar4 = dVar9;
  }
  buffer_00 = (Buffer *)CONCAT44(iStack_14,local_18);
  fi_00 = (vector<double,_std::allocator<double>_> *)CONCAT44(uStack_184,uVar3);
  this_00 = local_168;
  this = (RealValuedFastFourierTransform *)local_78;
  puVar8 = local_130;
  mVar7.m = in_stack_fffffffffffffe30;
  mVar7.x = (int)in_stack_fffffffffffffe28;
  mVar7.y = (int)((ulong)in_stack_fffffffffffffe28 >> 0x20);
  f_00.v = (double *)in_stack_fffffffffffffe20;
  f_00._0_8_ = in_stack_fffffffffffffe18;
  fERBs_00.v = (double *)in_stack_fffffffffffffe10;
  fERBs_00._0_8_ = in_stack_fffffffffffffe08;
  plan_00 = (RealValuedFastFourierTransform *)local_78._72_8_;
  fo_00 = vVar6.v;
  ppdVar10 = ppdStack_10;
  La(mVar7,f_00,fERBs_00,(RealValuedFastFourierTransform *)local_78._72_8_,fi_00,vVar6.v,buffer_00,
     (int)ppdStack_10,(int)uVar11,(int)pvVar12);
  for (local_78._44_4_ = 1; (int)local_78._44_4_ < local_18 + -2;
      local_78._44_4_ = local_78._44_4_ + 1) {
    for (local_78._40_4_ = 0; (int)local_78._40_4_ < (int)local_78._52_4_;
        local_78._40_4_ = local_78._40_4_ + 1) {
      dVar9 = local_20[(int)(local_78._40_4_ + local_78._32_4_)] * pdVar5[(int)local_78._40_4_];
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_78,
                          (long)(int)local_78._40_4_);
      *pvVar4 = dVar9;
    }
    in_stack_fffffffffffffe28 = CONCAT44(iStack_14,local_18);
    in_stack_fffffffffffffe18 = CONCAT44(uStack_184,uVar3);
    in_stack_fffffffffffffe08 = CONCAT44(local_78._68_4_,local_78._64_4_);
    this_00 = local_168;
    this = (RealValuedFastFourierTransform *)local_78;
    puVar8 = local_130;
    L_00.m = ppdStack_10;
    L_00.x = local_18;
    L_00.y = iStack_14;
    f_01.v = (double *)vVar6.v;
    f_01._0_8_ = in_stack_fffffffffffffe18;
    fERBs_01.v = (double *)local_78._72_8_;
    fERBs_01._0_8_ = in_stack_fffffffffffffe08;
    in_stack_fffffffffffffe10 = (RealValuedFastFourierTransform *)local_78._72_8_;
    in_stack_fffffffffffffe20 = vVar6.v;
    in_stack_fffffffffffffe30 = ppdStack_10;
    La(L_00,f_01,fERBs_01,plan_00,fi_00,fo_00,buffer_00,(int)ppdVar10,(int)uVar11,(int)pvVar12);
    local_78._32_4_ = local_78._48_4_ + local_78._32_4_;
  }
  while( true ) {
    if (local_18 <= (int)local_78._44_4_) break;
    for (local_78._40_4_ = 0; (int)local_78._40_4_ < local_28 - local_78._32_4_;
        local_78._40_4_ = local_78._40_4_ + 1) {
      dVar9 = local_20[(int)(local_78._40_4_ + local_78._32_4_)];
      dVar1 = pdVar5[(int)local_78._40_4_];
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_78,
                          (long)(int)local_78._40_4_);
      *pvVar4 = dVar9 * dVar1;
    }
    for (; (int)local_78._40_4_ < (int)local_78._52_4_; local_78._40_4_ = local_78._40_4_ + 1) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_78,
                          (long)(int)local_78._40_4_);
      *pvVar4 = 0.0;
    }
    this_00 = local_168;
    this = (RealValuedFastFourierTransform *)local_78;
    puVar8 = local_130;
    L_01.m = in_stack_fffffffffffffe30;
    L_01.x = (int)in_stack_fffffffffffffe28;
    L_01.y = (int)((ulong)in_stack_fffffffffffffe28 >> 0x20);
    f_02.v = (double *)in_stack_fffffffffffffe20;
    f_02._0_8_ = in_stack_fffffffffffffe18;
    fERBs_02.v = (double *)in_stack_fffffffffffffe10;
    fERBs_02._0_8_ = in_stack_fffffffffffffe08;
    La(L_01,f_02,fERBs_02,plan_00,fi_00,fo_00,buffer_00,(int)ppdVar10,(int)uVar11,(int)pvVar12);
    local_78._32_4_ = local_78._48_4_ + local_78._32_4_;
    local_78._44_4_ = local_78._44_4_ + 1;
  }
  yr_vector.v._0_4_ = (int)this;
  yr_vector._0_8_ = puVar8;
  yr_vector.v._4_4_ = (int)((ulong)this >> 0x20);
  freev(yr_vector);
  yr_vector_00.v._0_4_ = (int)this;
  yr_vector_00._0_8_ = puVar8;
  yr_vector_00.v._4_4_ = (int)((ulong)this >> 0x20);
  freev(yr_vector_00);
  for (local_78._44_4_ = 0; (int)local_78._44_4_ < local_18; local_78._44_4_ = local_78._44_4_ + 1)
  {
    local_78._24_8_ = (_func_int **)0x0;
    for (local_78._40_4_ = 0; (int)local_78._40_4_ < iStack_14;
        local_78._40_4_ = local_78._40_4_ + 1) {
      local_78._24_8_ =
           ppdStack_10[(int)local_78._44_4_][(int)local_78._40_4_] *
           ppdStack_10[(int)local_78._44_4_][(int)local_78._40_4_] + (double)local_78._24_8_;
    }
    if (((double)local_78._24_8_ != 0.0) || (NAN((double)local_78._24_8_))) {
      local_78._24_8_ = sqrt((double)local_78._24_8_);
      for (local_78._40_4_ = 0; (int)local_78._40_4_ < iStack_14;
          local_78._40_4_ = local_78._40_4_ + 1) {
        ppdStack_10[(int)local_78._44_4_][(int)local_78._40_4_] =
             ppdStack_10[(int)local_78._44_4_][(int)local_78._40_4_] / (double)local_78._24_8_;
      }
    }
  }
  RealValuedFastFourierTransform::Buffer::~Buffer((Buffer *)this);
  RealValuedFastFourierTransform::~RealValuedFastFourierTransform(this);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)this_00);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  mVar2.y = iStack_14;
  mVar2.x = local_18;
  mVar2.m = ppdStack_10;
  return mVar2;
}

Assistant:

matrix loudness(vector x, vector fERBs, double nyquist, int w, int w2) {
    int i, j, hi; 
    int offset = 0;
    double td = nyquist / w2; // this is equivalent to fstep
    // testing showed this configuration of fftw to be fastest
#if 0
    double* fi = fftw_malloc(sizeof(double) * w); 
    fftw_complex* fo = fftw_malloc(sizeof(fftw_complex) * w);
    fftw_plan plan = fftw_plan_dft_r2c_1d(w, fi, fo, FFTW_ESTIMATE); 
#else
    std::vector<double> fi(w); 
    std::vector<std::vector<double> > fo(2, std::vector<double>(w));
    sptk::RealValuedFastFourierTransform plan(w2 * 2 - 1, w2 * 2);
    sptk::RealValuedFastFourierTransform::Buffer buffer;
#endif
    vector hann = makev(w); // this defines the Hann[ing] window
    for (i = 0; i < w; i++) 
        hann.v[i] = .5 - (.5 * cos(2. * M_PI * ((double) i / w)));
    vector f = makev(w2);
    for (i = 0; i < w2; i++) 
        f.v[i] = i * td;
    hi = bisectv(f, fERBs.v[0]); // all calls to La() will begin here
    matrix L = makem(ceil((double) x.x / w2) + 1, fERBs.x); 
    for (j = 0; j < w2; j++) // left boundary case
        fi[j] = 0.; // more explicitly, 0. * hann.v[j]
    for (/* j = w2 */; j < w; j++) 
        fi[j] = x.v[j - w2] * hann.v[j];
#if 0
    La(L, f, fERBs, plan, fo, w2, hi, 0); 
#else
    La(L, f, fERBs, plan, fi, &fo, &buffer, w2, hi, 0); 
#endif
    for (i = 1; i < L.x - 2; i++) { 
        for (j = 0; j < w; j++) 
            fi[j] = x.v[j + offset] * hann.v[j];
#if 0
        La(L, f, fERBs, plan, fo, w2, hi, i); 
#else
        La(L, f, fERBs, plan, fi, &fo, &buffer, w2, hi, i); 
#endif
        offset += w2;
    }
    for (/* i = L.x - 2; */; i < L.x; i++) { // right two boundary cases
        for (j = 0; j < x.x - offset; j++) // this dies at x.x + w2
            fi[j] = x.v[j + offset] * hann.v[j];
        for (/* j = x.x - offset */; j < w; j++) 
            fi[j] = 0.; // once again, 0. * hann.v[j] 
#if 0
        La(L, f, fERBs, plan, fo, w2, hi, i);
#else
        La(L, f, fERBs, plan, fi, &fo, &buffer, w2, hi, i);
#endif
        offset += w2;
    } // now L is fully valued
    freev(hann);
    freev(f);
    // L must now be normalized
    for (i = 0; i < L.x; i++) { 
        td = 0.; // td is the value of the normalization factor
        for (j = 0; j < L.y; j++) 
            td += L.m[i][j] * L.m[i][j];
        if (td != 0.) { // catches zero-division
            td = sqrt(td);
            for (j = 0; j < L.y; j++) 
                L.m[i][j] /= td;
        } // otherwise, it is already 0.
    } 
#if 0
    fftw_destroy_plan(plan); 
    fftw_free(fi); 
    fftw_free(fo); 
#endif
    return(L);
}